

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterferentGraphBuilder.cpp
# Opt level: O2

void AssemblyCode::addNotOrientedEdge
               (string *a,string *b,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               *graph)

{
  bool bVar1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  bVar1 = std::operator!=(a,b);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)a);
    std::__cxx11::string::string((string *)&local_80,(string *)b);
    addOrientedEdge(&local_40,&local_80,graph);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string((string *)&local_60,(string *)b);
    std::__cxx11::string::string((string *)&local_a0,(string *)a);
    addOrientedEdge(&local_60,&local_a0,graph);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    return;
  }
  __assert_fail("a != b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/register_allocation/InterferentGraphBuilder.cpp"
                ,0x15,
                "void AssemblyCode::addNotOrientedEdge(std::string, std::string, std::map<std::string, std::set<std::string>> &)"
               );
}

Assistant:

void AssemblyCode::addNotOrientedEdge(std::string a, std::string b, std::map<std::string, std::set<std::string>>& graph) {
    assert(a != b);

    addOrientedEdge(a, b, graph);
    addOrientedEdge(b, a, graph);
}